

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::NotEqual(VirtualMachine *this)

{
  bool bVar1;
  Variable VVar2;
  Variable VVar3;
  Variable var1;
  Variable first;
  Variable second;
  VirtualMachine *this_local;
  
  VVar2 = popOpStack(this);
  VVar3 = popOpStack(this);
  var1.field_1 = VVar3.field_1;
  var1._4_4_ = 0;
  var1.type = VVar3.type;
  VVar3._4_4_ = 0;
  VVar3.type = VVar2.type;
  VVar3.field_1.integerValue = VVar2.field_1.integerValue;
  bVar1 = variableEquals(this,var1,VVar3);
  pushBoolean(this,(bool)((bVar1 ^ 0xffU) & 1));
  advance(this);
  return;
}

Assistant:

void runtime::VirtualMachine::NotEqual() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  this->pushBoolean(!this->variableEquals(first, second));
  this->advance();
}